

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O0

err_t cmdSigPrintCertc(cmd_sig_t *sig)

{
  size_t sVar1;
  long in_RDI;
  size_t count;
  size_t cert_len;
  octet *cert;
  size_t certs_len;
  octet *in_stack_ffffffffffffffc8;
  ulong local_30;
  long local_18;
  
  local_18 = *(long *)(in_RDI + 0x620);
  local_30 = 0;
  while( true ) {
    if (local_18 == 0) {
      printf("%u",local_30 & 0xffffffff);
      return 0;
    }
    sVar1 = btokCVCLen(in_stack_ffffffffffffffc8,0x10ade8);
    if (sVar1 == 0xffffffffffffffff) break;
    local_18 = local_18 - sVar1;
    local_30 = local_30 + 1;
  }
  return 0x202;
}

Assistant:

static err_t cmdSigPrintCertc(const cmd_sig_t* sig)
{
	size_t certs_len;
	const octet* cert;
	size_t cert_len;
	size_t count;
	// определить число сертификатов
	certs_len = sig->certs_len, cert = sig->certs, count = 0;
	while (certs_len)
	{
		cert_len = btokCVCLen(cert, certs_len);
		if (cert_len == SIZE_MAX)
			return ERR_BAD_CERT;
		certs_len -= cert_len, cert += cert_len, ++count;
	}
	// печатать число сертификатов
	printf("%u", (unsigned)count);
	return ERR_OK;
}